

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_int8.h
# Opt level: O2

void ncnn::convolution_im2col_sgemm_transform_kernel_int8_sse
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  long lVar1;
  int _c;
  int iVar2;
  void *pvVar3;
  uint _w;
  ulong uVar4;
  uint _w_00;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  Mat local_78;
  
  _w = kernel_w * kernel_h;
  Mat::reshape(&local_78,_kernel,_w,inch,outch,(Allocator *)0x0);
  iVar2 = inch;
  if (outch < 4) {
    _c = outch;
    _w_00 = _w;
    if (3 < inch) {
      _w_00 = _w * 4;
      iVar2 = ((uint)inch >> 2) * -3 + inch;
    }
  }
  else if (inch < 4) {
    _c = ((uint)outch >> 2) * -3 + outch;
    _w_00 = _w * 4;
  }
  else {
    iVar2 = ((uint)inch >> 2) * -3 + inch;
    _c = ((uint)outch >> 2) * -3 + outch;
    _w_00 = _w * 0x10;
  }
  uVar9 = 0;
  Mat::create(kernel_tm,_w_00,iVar2,_c,1,(Allocator *)0x0);
  uVar4 = (ulong)_w;
  if ((int)_w < 1) {
    uVar4 = uVar9;
  }
  lVar1 = (long)inch;
  for (; (long)(uVar9 | 3) < (long)outch; uVar9 = uVar9 + 4) {
    pvVar3 = (void *)((uVar9 >> 2) * kernel_tm->cstep * kernel_tm->elemsize + (long)kernel_tm->data)
    ;
    for (uVar5 = 0; (long)(uVar5 | 3) < lVar1; uVar5 = uVar5 + 4) {
      for (uVar6 = 0; uVar6 != uVar4; uVar6 = uVar6 + 1) {
        for (uVar7 = 0; uVar7 != 4; uVar7 = uVar7 + 1) {
          for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
            *(undefined1 *)((long)pvVar3 + lVar8) =
                 *(undefined1 *)
                  ((long)local_78.data +
                  uVar6 + (uVar5 + lVar8) * (long)local_78.w * local_78.elemsize +
                          local_78.cstep * (uVar7 | uVar9) * local_78.elemsize);
          }
          pvVar3 = (void *)((long)pvVar3 + 4);
        }
      }
    }
    for (; (long)uVar5 < lVar1; uVar5 = uVar5 + 1) {
      for (uVar6 = 0; uVar6 != uVar4; uVar6 = uVar6 + 1) {
        for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
          *(undefined1 *)((long)pvVar3 + lVar8) =
               *(undefined1 *)
                ((long)local_78.data +
                uVar6 + (long)local_78.w * uVar5 * local_78.elemsize +
                        (uVar9 + lVar8) * local_78.cstep * local_78.elemsize);
        }
        pvVar3 = (void *)((long)pvVar3 + 4);
      }
    }
  }
  for (; (long)uVar9 < (long)outch; uVar9 = uVar9 + 1) {
    pvVar3 = (void *)((ulong)(((uint)uVar9 & 3) + ((uint)(uVar9 >> 2) & 0x3fffffff)) *
                      kernel_tm->cstep * kernel_tm->elemsize + (long)kernel_tm->data);
    for (uVar5 = 0; (long)(uVar5 | 3) < lVar1; uVar5 = uVar5 + 4) {
      for (uVar6 = 0; uVar6 != uVar4; uVar6 = uVar6 + 1) {
        for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
          *(undefined1 *)((long)pvVar3 + lVar8) =
               *(undefined1 *)
                ((long)local_78.data +
                uVar6 + (uVar5 + lVar8) * (long)local_78.w * local_78.elemsize +
                        local_78.cstep * uVar9 * local_78.elemsize);
        }
        pvVar3 = (void *)((long)pvVar3 + 4);
      }
    }
    for (; (long)uVar5 < lVar1; uVar5 = uVar5 + 1) {
      for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
        *(undefined1 *)((long)pvVar3 + uVar6) =
             *(undefined1 *)
              ((long)local_78.data +
              uVar6 + ((long)local_78.w * uVar5 + local_78.cstep * uVar9) * local_78.elemsize);
      }
      pvVar3 = (void *)((long)pvVar3 + uVar6);
    }
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        free(local_78.data);
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void convolution_im2col_sgemm_transform_kernel_int8_sse(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

#if __SSE2__
    // interleave
    // src = maxk-inch-outch
    // dst = 4a-4b-maxk-inch/4a-outch/4b
    Mat kernel = _kernel.reshape(maxk, inch, outch);
    if (outch >= 4)
    {
        if (inch >= 4)
            kernel_tm.create(16 * maxk, inch / 4 + inch % 4, outch / 4 + outch % 4, (size_t)1u);
        else
            kernel_tm.create(4 * maxk, inch, outch / 4 + outch % 4, (size_t)1u);
    }
    else
    {
        if (inch >= 4)
            kernel_tm.create(4 * maxk, inch / 4 + inch % 4, outch, (size_t)1u);
        else
            kernel_tm.create(1 * maxk, inch, outch, (size_t)1u);
    }

    int q = 0;
    for (; q + 3 < outch; q += 4)
    {
        signed char* g00 = kernel_tm.channel(q / 4);

        int p = 0;
        for (; p + 3 < inch; p += 4)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 4; i++)
                {
                    for (int j = 0; j < 4; j++)
                    {
                        const signed char* k00 = kernel.channel(q + i).row<const signed char>(p + j);

                        g00[0] = k00[k];

                        g00++;
                    }
                }
            }
        }
        for (; p < inch; p++)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 4; i++)
                {
                    const signed char* k00 = kernel.channel(q + i).row<const signed char>(p);

                    g00[0] = k00[k];

                    g00++;
                }
            }
        }
    }
    // TODO unroll 2
    for (; q < outch; q++)
    {
        signed char* g00 = kernel_tm.channel(q / 4 + q % 4);

        int p = 0;
        for (; p + 3 < inch; p += 4)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int j = 0; j < 4; j++)
                {
                    const signed char* k00 = kernel.channel(q).row<const signed char>(p + j);

                    g00[0] = k00[k];

                    g00++;
                }
            }
        }
        for (; p < inch; p++)
        {
            for (int k = 0; k < maxk; k++)
            {
                const signed char* k00 = kernel.channel(q).row<const signed char>(p);

                g00[0] = k00[k];

                g00++;
            }
        }
    }
#else  // __SSE2__
    kernel_tm = _kernel.reshape(maxk, inch, outch);
#endif // __SSE2__
}